

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O1

void __thiscall QTriangulatingStroker::endCap(QTriangulatingStroker *this,qreal *param_1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QVarLengthArray<float,_256LL> points;
  QVarLengthArray<float,_256LL> local_448;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(this + 100) == 0x20) {
    memset(&local_448,0xaa,0x418);
    local_448.super_QVLABase<float>.super_QVLABaseBase.a = 0x100;
    local_448.super_QVLABase<float>.super_QVLABaseBase.s = 0;
    lVar5 = *(long *)(this + 0x10);
    lVar9 = *(long *)(this + 8) << 0x20;
    local_448.super_QVLABase<float>.super_QVLABaseBase.ptr =
         &local_448.super_QVLAStorage<4UL,_4UL,_256LL>;
    arcPoints(this,*(float *)(this + 0x18),*(float *)(this + 0x1c),
              *(float *)(lVar5 + (lVar9 + -0x200000000 >> 0x1e)),
              *(float *)(lVar5 + (lVar9 + -0x100000000 >> 0x1e)),
              *(float *)(lVar5 + (lVar9 + -0x400000000 >> 0x1e)),
              *(float *)(lVar5 + (lVar9 + -0x300000000 >> 0x1e)),&local_448);
    iVar8 = (int)(local_448.super_QVLABase<float>.super_QVLABaseBase.s / 2);
    if (iVar8 != 0) {
      uVar10 = 0;
      uVar12 = (long)iVar8;
      do {
        pvVar6 = local_448.super_QVLABase<float>.super_QVLABaseBase.ptr;
        uVar11 = uVar12 - 1;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,*(long *)(this + 8) + 1);
        pvVar7 = local_448.super_QVLABase<float>.super_QVLABaseBase.ptr;
        lVar5 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar5 * 4) =
             *(undefined4 *)((char *)pvVar6 + uVar12 * 8 + -8);
        *(long *)(this + 8) = lVar5 + 1;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar5 + 2);
        pvVar6 = local_448.super_QVLABase<float>.super_QVLABaseBase.ptr;
        lVar5 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar5 * 4) =
             *(undefined4 *)((char *)pvVar7 + uVar12 * 8 + -4);
        *(long *)(this + 8) = lVar5 + 1;
        if (uVar10 == (uVar11 & 0xffffffff)) break;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar5 + 2);
        pvVar7 = local_448.super_QVLABase<float>.super_QVLABaseBase.ptr;
        lVar5 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar5 * 4) =
             *(undefined4 *)((char *)pvVar6 + uVar10 * 8);
        *(long *)(this + 8) = lVar5 + 1;
        QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar5 + 2);
        lVar5 = *(long *)(this + 8);
        *(undefined4 *)(*(long *)(this + 0x10) + lVar5 * 4) =
             *(undefined4 *)((char *)pvVar7 + uVar10 * 8 + 4);
        *(long *)(this + 8) = lVar5 + 1;
        uVar10 = uVar10 + 1;
        uVar12 = uVar11;
      } while (uVar10 != (uVar11 & 0xffffffff));
    }
    if ((QVLAStorage<4UL,_4UL,_256LL> *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr !=
        &local_448.super_QVLAStorage<4UL,_4UL,_256LL>) {
      QtPrivate::sizedFree
                (local_448.super_QVLABase<float>.super_QVLABaseBase.ptr,
                 local_448.super_QVLABase<float>.super_QVLABaseBase.a << 2);
    }
  }
  else if (*(int *)(this + 100) == 0x10) {
    fVar1 = *(float *)(this + 0x24);
    fVar2 = *(float *)(this + 0x18);
    fVar3 = *(float *)(this + 0x1c);
    fVar4 = *(float *)(this + 0x20);
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,*(long *)(this + 8) + 1);
    lVar5 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar5 * 4) = fVar2 + fVar1 + fVar4;
    *(long *)(this + 8) = lVar5 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar5 + 2);
    lVar5 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar5 * 4) = fVar1 + (fVar3 - fVar4);
    *(long *)(this + 8) = lVar5 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar5 + 2);
    lVar5 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar5 * 4) = (fVar2 + fVar1) - fVar4;
    *(long *)(this + 8) = lVar5 + 1;
    QDataBuffer<float>::reserve((QDataBuffer<float> *)this,lVar5 + 2);
    lVar5 = *(long *)(this + 8);
    *(float *)(*(long *)(this + 0x10) + lVar5 * 4) = (fVar3 - fVar4) - fVar1;
    *(long *)(this + 8) = lVar5 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::endCap(const qreal *)
{
    switch (m_cap_style) {
    case Qt::FlatCap:
        break;
    case Qt::SquareCap:
        emitLineSegment(m_cx + m_nvy, m_cy - m_nvx, m_nvx, m_nvy);
        break;
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        int count = m_vertices.size();
        arcPoints(m_cx, m_cy, m_vertices.at(count - 2), m_vertices.at(count - 1), m_vertices.at(count - 4), m_vertices.at(count - 3), points);
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.add(points[2 * end - 2]);
            m_vertices.add(points[2 * end - 1]);
            --end;
            if (front == end)
                break;
            m_vertices.add(points[2 * front + 0]);
            m_vertices.add(points[2 * front + 1]);
            ++front;
        }
        break; }
    default: break; // to shut gcc up...
    }
}